

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O2

void pg::freeze_thaw_reset_rec_SPAWN
               (WorkerP *w,Task *__dq_head,FPISolver *arg_1,int arg_2,int arg_3,int arg_4)

{
  Worker *pWVar1;
  uint uVar2;
  ulong uVar3;
  
  if (w->end == __dq_head) {
    lace_abort_stack_overflow();
  }
  __dq_head->f = freeze_thaw_reset_rec_WRAP;
  (__dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
  *(FPISolver **)__dq_head->d = arg_1;
  *(int *)(__dq_head->d + 8) = arg_2;
  *(int *)(__dq_head->d + 0xc) = arg_3;
  *(int *)(__dq_head->d + 0x10) = arg_4;
  pWVar1 = w->_public;
  if (w->allstolen == '\0') {
    if (pWVar1->movesplit == '\0') {
      return;
    }
    uVar2 = (uint)((int)((ulong)((long)__dq_head - (long)w->dq) >> 6) + 2 +
                  (int)((ulong)((long)w->split - (long)w->dq) >> 6)) >> 1;
    LOCK();
    *(uint *)((long)&pWVar1->ts + 4) = uVar2;
    UNLOCK();
    w->split = w->dq + uVar2;
    pWVar1->movesplit = '\0';
    return;
  }
  if (pWVar1->movesplit != '\0') {
    pWVar1->movesplit = '\0';
  }
  uVar3 = (long)__dq_head - (long)w->dq;
  LOCK();
  pWVar1->ts = (TailSplit)
               ((uVar3 >> 6 & 0xffffffff | (uVar3 & 0xffffffffffffffc0) << 0x1a) + 0x100000000);
  UNLOCK();
  pWVar1->allstolen = '\0';
  w->split = __dq_head + 1;
  w->allstolen = '\0';
  return;
}

Assistant:

VOID_TASK_4(freeze_thaw_reset_rec, FPISolver*, solver, int, i, int, n, int, p)
{
    if (n>128) {
        // because dynamic bitset is not thread safe, work in blocks of 64...
        if (i&127) {
            // start not yet aligned
            int N = 128 - (i&127);
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            solver->freezeThawReset(i, N, p);
            SYNC(freeze_thaw_reset_rec);
        } else {
            int N = (n/128)*64;
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            CALL(freeze_thaw_reset_rec, solver, i, N, p);
            SYNC(freeze_thaw_reset_rec);
        }
    } else {
        solver->freezeThawReset(i, n, p);
    }
}